

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_inner_http.c
# Opt level: O0

int on_header_value(http_parser *parser,char *at,size_t length)

{
  long lVar1;
  asterism_http_incoming_s *obj;
  size_t length_local;
  char *at_local;
  http_parser *parser_local;
  
  lVar1._0_2_ = parser[1].http_major;
  lVar1._2_2_ = parser[1].http_minor;
  lVar1._4_4_ = *(undefined4 *)&parser[1].field_0x14;
  if (lVar1 == 0) {
    *(char **)&parser[1].http_major = at;
    parser[1].data = (void *)(length + (long)parser[1].data);
  }
  else {
    parser[1].data = (void *)(length + (long)parser[1].data);
  }
  if (*(long *)(parser + 1) != 0) {
    parse_key((asterism_http_incoming_s *)&parser[-0x91].content_length);
  }
  return 0;
}

Assistant:

static int on_header_value(http_parser *parser, const char *at, size_t length)
{
    struct asterism_http_incoming_s *obj = __CONTAINER_PTR(struct asterism_http_incoming_s, parser, parser);
    if (obj->http_header_value_temp.p)
    {
        obj->http_header_value_temp.len += length;
    }
    else
    {
        obj->http_header_value_temp.p = at;
        obj->http_header_value_temp.len += length;
    }
    if (obj->http_header_field_temp.p)
    {
        parse_key(obj);
    }
    return 0;
}